

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_dx_iface.c
# Opt level: O2

aom_codec_err_t ctrl_set_ext_ref_ptr(aom_codec_alg_priv_t *ctx,__va_list_tag *args)

{
  uint uVar1;
  long *plVar2;
  aom_image_t *img;
  int iVar3;
  undefined8 *puVar4;
  av1_ext_ref_frame_t *ext_frames;
  int i;
  long lVar5;
  aom_codec_err_t aVar6;
  YV12_BUFFER_CONFIG *yv12;
  
  uVar1 = args->gp_offset;
  if ((ulong)uVar1 < 0x29) {
    puVar4 = (undefined8 *)((ulong)uVar1 + (long)args->reg_save_area);
    args->gp_offset = uVar1 + 8;
  }
  else {
    puVar4 = (undefined8 *)args->overflow_arg_area;
    args->overflow_arg_area = puVar4 + 1;
  }
  plVar2 = (long *)*puVar4;
  if (plVar2 == (long *)0x0) {
    aVar6 = AOM_CODEC_INVALID_PARAM;
  }
  else {
    iVar3 = (int)plVar2[1];
    yv12 = (ctx->ext_refs).refs;
    (ctx->ext_refs).num = iVar3;
    aVar6 = AOM_CODEC_OK;
    for (lVar5 = 0; lVar5 < iVar3; lVar5 = lVar5 + 1) {
      img = (aom_image_t *)*plVar2;
      *plVar2 = (long)(img + 1);
      image2yuvconfig(img,yv12);
      iVar3 = (ctx->ext_refs).num;
      yv12 = yv12 + 1;
    }
  }
  return aVar6;
}

Assistant:

static aom_codec_err_t ctrl_set_ext_ref_ptr(aom_codec_alg_priv_t *ctx,
                                            va_list args) {
  av1_ext_ref_frame_t *const data = va_arg(args, av1_ext_ref_frame_t *);

  if (data) {
    av1_ext_ref_frame_t *const ext_frames = data;
    ctx->ext_refs.num = ext_frames->num;
    for (int i = 0; i < ctx->ext_refs.num; i++) {
      image2yuvconfig(ext_frames->img++, &ctx->ext_refs.refs[i]);
    }
    return AOM_CODEC_OK;
  } else {
    return AOM_CODEC_INVALID_PARAM;
  }
}